

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_loadZstdDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  uint uVar1;
  U32 UVar2;
  ulong uVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  uint local_214;
  uint local_204;
  size_t errcod_6;
  U32 u;
  size_t errcod_5;
  U32 maxOffset;
  U32 offcodeMax;
  size_t dictContentSize;
  size_t errcod_4;
  size_t errcod_3;
  size_t litlengthHeaderSize;
  uint litlengthLog;
  uint litlengthMaxValue;
  short litlengthNCount [36];
  size_t errcod_2;
  size_t errcod_1;
  size_t matchlengthHeaderSize;
  uint matchlengthLog;
  uint matchlengthMaxValue;
  short matchlengthNCount [53];
  size_t errcod;
  size_t offcodeHeaderSize;
  size_t sStack_b8;
  uint offcodeLog;
  size_t hufHeaderSize;
  ZSTD_compressedBlockState_t *pZStack_a8;
  uint maxSymbolValue;
  size_t dictID;
  short local_98 [2];
  uint offcodeMaxValue;
  short offcodeNCount [32];
  BYTE *dictEnd;
  BYTE *dictPtr;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_matchState_t *ms_local;
  ZSTD_compressedBlockState_t *bs_local;
  
  uVar3 = (long)dict + dictSize;
  dictID._4_4_ = 0x1f;
  if ((params->fParams).noDictIDFlag == 0) {
    local_204 = MEM_readLE32((void *)((long)dict + 4));
  }
  else {
    local_204 = 0;
  }
  pZStack_a8 = (ZSTD_compressedBlockState_t *)(ulong)local_204;
  pvVar4 = (void *)((long)dict + 8);
  hufHeaderSize._4_4_ = 0xff;
  sStack_b8 = HUF_readCTable((HUF_CElt *)bs,(uint *)((long)&hufHeaderSize + 4),pvVar4,
                             uVar3 - (long)pvVar4);
  uVar1 = ERR_isError(sStack_b8);
  if (uVar1 == 0) {
    if (hufHeaderSize._4_4_ < 0xff) {
      bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
    }
    else {
      pvVar4 = (void *)(sStack_b8 + (long)pvVar4);
      sVar5 = FSE_readNCount(local_98,(uint *)((long)&dictID + 4),
                             (uint *)((long)&offcodeHeaderSize + 4),pvVar4,uVar3 - (long)pvVar4);
      uVar1 = ERR_isError(sVar5);
      if (uVar1 == 0) {
        if (offcodeHeaderSize._4_4_ < 9) {
          sVar6 = FSE_buildCTable_wksp
                            ((bs->entropy).fse.offcodeCTable,local_98,0x1f,offcodeHeaderSize._4_4_,
                             workspace,0x1800);
          uVar1 = ERR_isError(sVar6);
          if (uVar1 == 0) {
            pvVar4 = (void *)(sVar5 + (long)pvVar4);
            matchlengthHeaderSize._4_4_ = 0x34;
            sVar5 = FSE_readNCount((short *)&matchlengthLog,
                                   (uint *)((long)&matchlengthHeaderSize + 4),
                                   (uint *)&matchlengthHeaderSize,pvVar4,uVar3 - (long)pvVar4);
            uVar1 = ERR_isError(sVar5);
            if (uVar1 == 0) {
              if ((uint)matchlengthHeaderSize < 10) {
                bs_local = (ZSTD_compressedBlockState_t *)
                           ZSTD_checkDictNCount
                                     ((short *)&matchlengthLog,matchlengthHeaderSize._4_4_,0x34);
                uVar1 = ERR_isError((size_t)bs_local);
                if (uVar1 == 0) {
                  sVar6 = FSE_buildCTable_wksp
                                    ((bs->entropy).fse.matchlengthCTable,(short *)&matchlengthLog,
                                     matchlengthHeaderSize._4_4_,(uint)matchlengthHeaderSize,
                                     workspace,0x1800);
                  uVar1 = ERR_isError(sVar6);
                  if (uVar1 == 0) {
                    pvVar4 = (void *)(sVar5 + (long)pvVar4);
                    litlengthHeaderSize._4_4_ = 0x23;
                    sVar5 = FSE_readNCount((short *)&litlengthLog,
                                           (uint *)((long)&litlengthHeaderSize + 4),
                                           (uint *)&litlengthHeaderSize,pvVar4,uVar3 - (long)pvVar4)
                    ;
                    uVar1 = ERR_isError(sVar5);
                    if (uVar1 == 0) {
                      if ((uint)litlengthHeaderSize < 10) {
                        bs_local = (ZSTD_compressedBlockState_t *)
                                   ZSTD_checkDictNCount
                                             ((short *)&litlengthLog,litlengthHeaderSize._4_4_,0x23)
                        ;
                        uVar1 = ERR_isError((size_t)bs_local);
                        if (uVar1 == 0) {
                          sVar6 = FSE_buildCTable_wksp
                                            ((bs->entropy).fse.litlengthCTable,
                                             (short *)&litlengthLog,litlengthHeaderSize._4_4_,
                                             (uint)litlengthHeaderSize,workspace,0x1800);
                          uVar1 = ERR_isError(sVar6);
                          if (uVar1 == 0) {
                            pvVar4 = (void *)(sVar5 + (long)pvVar4);
                            if (uVar3 < (long)pvVar4 + 0xcU) {
                              bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                            }
                            else {
                              UVar2 = MEM_readLE32(pvVar4);
                              bs->rep[0] = UVar2;
                              UVar2 = MEM_readLE32((void *)((long)pvVar4 + 4));
                              bs->rep[1] = UVar2;
                              UVar2 = MEM_readLE32((void *)((long)pvVar4 + 8));
                              bs->rep[2] = UVar2;
                              uVar3 = uVar3 - ((long)pvVar4 + 0xc);
                              errcod_5._4_4_ = 0x1f;
                              if (uVar3 < 0xfffe0000) {
                                errcod_5._4_4_ = ZSTD_highbit32((int)uVar3 + 0x20000);
                              }
                              if (errcod_5._4_4_ < 0x1f) {
                                local_214 = errcod_5._4_4_;
                              }
                              else {
                                local_214 = 0x1f;
                              }
                              bs_local = (ZSTD_compressedBlockState_t *)
                                         ZSTD_checkDictNCount(local_98,dictID._4_4_,local_214);
                              uVar1 = ERR_isError((size_t)bs_local);
                              if (uVar1 == 0) {
                                for (errcod_6._4_4_ = 0; errcod_6._4_4_ < 3;
                                    errcod_6._4_4_ = errcod_6._4_4_ + 1) {
                                  if (bs->rep[errcod_6._4_4_] == 0) {
                                    return 0xffffffffffffffe2;
                                  }
                                  if (uVar3 < bs->rep[errcod_6._4_4_]) {
                                    return 0xffffffffffffffe2;
                                  }
                                }
                                (bs->entropy).huf.repeatMode = HUF_repeat_valid;
                                (bs->entropy).fse.offcode_repeatMode = FSE_repeat_valid;
                                (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_valid;
                                (bs->entropy).fse.litlength_repeatMode = FSE_repeat_valid;
                                bs_local = (ZSTD_compressedBlockState_t *)
                                           ZSTD_loadDictionaryContent
                                                     (ms,params,(void *)((long)pvVar4 + 0xc),uVar3,
                                                      dtlm);
                                uVar1 = ERR_isError((size_t)bs_local);
                                if (uVar1 == 0) {
                                  bs_local = pZStack_a8;
                                }
                              }
                            }
                          }
                          else {
                            bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                          }
                        }
                      }
                      else {
                        bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                      }
                    }
                    else {
                      bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                    }
                  }
                  else {
                    bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                  }
                }
              }
              else {
                bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
              }
            }
            else {
              bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
            }
          }
          else {
            bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
          }
        }
        else {
          bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
        }
      }
      else {
        bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
      }
    }
  }
  else {
    bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
  }
  return (size_t)bs_local;
}

Assistant:

static size_t ZSTD_loadZstdDictionary(ZSTD_compressedBlockState_t* bs,
                                      ZSTD_matchState_t* ms,
                                      ZSTD_CCtx_params const* params,
                                      const void* dict, size_t dictSize,
                                      ZSTD_dictTableLoadMethod_e dtlm,
                                      void* workspace)
{
    const BYTE* dictPtr = (const BYTE*)dict;
    const BYTE* const dictEnd = dictPtr + dictSize;
    short offcodeNCount[MaxOff+1];
    unsigned offcodeMaxValue = MaxOff;
    size_t dictID;

    ZSTD_STATIC_ASSERT(HUF_WORKSPACE_SIZE >= (1<<MAX(MLFSELog,LLFSELog)));
    assert(dictSize > 8);
    assert(MEM_readLE32(dictPtr) == ZSTD_MAGIC_DICTIONARY);

    dictPtr += 4;   /* skip magic number */
    dictID = params->fParams.noDictIDFlag ? 0 :  MEM_readLE32(dictPtr);
    dictPtr += 4;

    {   unsigned maxSymbolValue = 255;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr, dictEnd-dictPtr);
        if (HUF_isError(hufHeaderSize)) return ERROR(dictionary_corrupted);
        if (maxSymbolValue < 255) return ERROR(dictionary_corrupted);
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(offcodeHeaderSize)) return ERROR(dictionary_corrupted);
        if (offcodeLog > OffFSELog) return ERROR(dictionary_corrupted);
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        /* fill all offset symbols to avoid garbage at end of table */
        CHECK_E( FSE_buildCTable_wksp(bs->entropy.fse.offcodeCTable,
                                    offcodeNCount, MaxOff, offcodeLog,
                                    workspace, HUF_WORKSPACE_SIZE),
                 dictionary_corrupted);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(matchlengthHeaderSize)) return ERROR(dictionary_corrupted);
        if (matchlengthLog > MLFSELog) return ERROR(dictionary_corrupted);
        /* Every match length code must have non-zero probability */
        CHECK_F( ZSTD_checkDictNCount(matchlengthNCount, matchlengthMaxValue, MaxML));
        CHECK_E( FSE_buildCTable_wksp(bs->entropy.fse.matchlengthCTable,
                                    matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                                    workspace, HUF_WORKSPACE_SIZE),
                 dictionary_corrupted);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(litlengthHeaderSize)) return ERROR(dictionary_corrupted);
        if (litlengthLog > LLFSELog) return ERROR(dictionary_corrupted);
        /* Every literal length code must have non-zero probability */
        CHECK_F( ZSTD_checkDictNCount(litlengthNCount, litlengthMaxValue, MaxLL));
        CHECK_E( FSE_buildCTable_wksp(bs->entropy.fse.litlengthCTable,
                                    litlengthNCount, litlengthMaxValue, litlengthLog,
                                    workspace, HUF_WORKSPACE_SIZE),
                 dictionary_corrupted);
        dictPtr += litlengthHeaderSize;
    }

    if (dictPtr+12 > dictEnd) return ERROR(dictionary_corrupted);
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    {   size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        U32 offcodeMax = MaxOff;
        if (dictContentSize <= ((U32)-1) - 128 KB) {
            U32 const maxOffset = (U32)dictContentSize + 128 KB; /* The maximum offset that must be supported */
            offcodeMax = ZSTD_highbit32(maxOffset); /* Calculate minimum offset code required to represent maxOffset */
        }
        /* All offset values <= dictContentSize + 128 KB must be representable */
        CHECK_F (ZSTD_checkDictNCount(offcodeNCount, offcodeMaxValue, MIN(offcodeMax, MaxOff)));
        /* All repCodes must be <= dictContentSize and != 0*/
        {   U32 u;
            for (u=0; u<3; u++) {
                if (bs->rep[u] == 0) return ERROR(dictionary_corrupted);
                if (bs->rep[u] > dictContentSize) return ERROR(dictionary_corrupted);
        }   }

        bs->entropy.huf.repeatMode = HUF_repeat_valid;
        bs->entropy.fse.offcode_repeatMode = FSE_repeat_valid;
        bs->entropy.fse.matchlength_repeatMode = FSE_repeat_valid;
        bs->entropy.fse.litlength_repeatMode = FSE_repeat_valid;
        CHECK_F(ZSTD_loadDictionaryContent(ms, params, dictPtr, dictContentSize, dtlm));
        return dictID;
    }
}